

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tonk.cpp
# Opt level: O0

TonkResult TonkResultFromDetailedResult(Result *result)

{
  Result *result_local;
  TonkResult local_c;
  
  if (result->Error == (ErrorResult *)0x0) {
    local_c = Tonk_Success;
  }
  else {
    switch(result->Error->Type) {
    case Tonk:
      local_c = (TonkResult)result->Error->Code;
      break;
    case Siamese:
      local_c = Tonk_FECFailed;
      break;
    case Asio:
      local_c = Tonk_NetworkFailed;
      break;
    case Cymric:
      local_c = Tonk_PRNGFailed;
      break;
    case LastErr:
      local_c = Tonk_NetworkFailed;
      break;
    default:
      local_c = Tonk_Error;
    }
  }
  return local_c;
}

Assistant:

static TonkResult TonkResultFromDetailedResult(const Result& result)
{
    if (result.IsGood())
        return Tonk_Success;

    switch (result.Error->Type)
    {
    case ErrorType::Tonk:    return (TonkResult)result.Error->Code;
    case ErrorType::Asio:    return Tonk_NetworkFailed;
    case ErrorType::Cymric:  return Tonk_PRNGFailed;
    case ErrorType::Siamese: return Tonk_FECFailed;
    case ErrorType::LastErr: return Tonk_NetworkFailed; // TBD: Disambiguate this?
    default:
        break;
    }

    return Tonk_Error;
}